

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<bool>::Iterator::Current(Iterator *this)

{
  const_reference cVar1;
  pointer pbVar2;
  Iterator *this_local;
  
  pbVar2 = std::unique_ptr<const_bool,_std::default_delete<const_bool>_>::get(&this->value_);
  if (pbVar2 == (pointer)0x0) {
    pbVar2 = (pointer)operator_new(1);
    cVar1 = std::_Bit_const_iterator::operator*(&this->iterator_);
    *pbVar2 = cVar1;
    std::unique_ptr<const_bool,_std::default_delete<const_bool>_>::reset(&this->value_,pbVar2);
  }
  pbVar2 = std::unique_ptr<const_bool,_std::default_delete<const_bool>_>::get(&this->value_);
  return pbVar2;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }